

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFilePostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  cmValue local_128;
  string local_120;
  string *local_100;
  cmAlphaNum local_f8;
  string local_b8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string configProp;
  string frameworkPostfix;
  cmValue postfix;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  cmValue::cmValue((cmValue *)((long)&frameworkPostfix.field_2 + 8),(nullptr_t)0x0);
  std::__cxx11::string::string((string *)(configProp.field_2._M_local_buf + 8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_b8,config);
    cmAlphaNum::cmAlphaNum(&local_98,&local_b8);
    cmAlphaNum::cmAlphaNum(&local_f8,"_POSTFIX");
    cmStrCat<>((string *)local_68,&local_98,&local_f8);
    std::__cxx11::string::~string((string *)&local_b8);
    local_100 = (string *)GetProperty(this,(string *)local_68);
    frameworkPostfix.field_2._8_8_ = local_100;
    bVar1 = IsImported(this);
    if (((!bVar1) &&
        (bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&frameworkPostfix.field_2 + 8)),
        bVar1)) &&
       ((bVar1 = IsAppBundleOnApple(this), bVar1 || (bVar1 = IsFrameworkOnApple(this), bVar1)))) {
      cmValue::operator=((cmValue *)((long)&frameworkPostfix.field_2 + 8),(nullptr_t)0x0);
    }
    GetFrameworkMultiConfigPostfix(&local_120,this,config);
    std::__cxx11::string::operator=
              ((string *)(configProp.field_2._M_local_buf + 8),(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      cmValue::cmValue(&local_128,(string *)((long)&configProp.field_2 + 8));
      frameworkPostfix.field_2._8_8_ = local_128.Value;
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&frameworkPostfix.field_2 + 8));
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&frameworkPostfix.field_2 + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)(configProp.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePostfix(const std::string& config) const
{
  cmValue postfix = nullptr;
  std::string frameworkPostfix;
  if (!config.empty()) {
    std::string configProp =
      cmStrCat(cmSystemTools::UpperCase(config), "_POSTFIX");
    postfix = this->GetProperty(configProp);

    // Mac application bundles and frameworks have no regular postfix like
    // libraries do.
    if (!this->IsImported() && postfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      postfix = nullptr;
    }

    // Frameworks created by multi config generators can have a special
    // framework postfix.
    frameworkPostfix = this->GetFrameworkMultiConfigPostfix(config);
    if (!frameworkPostfix.empty()) {
      postfix = cmValue(frameworkPostfix);
    }
  }
  return postfix ? *postfix : std::string();
}